

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::setDualColBounds(SPxSolverBase<double> *this)

{
  double *pdVar1;
  double *pdVar2;
  pointer pdVar3;
  long lVar4;
  
  if (0 < (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    lVar4 = 0;
    do {
      pdVar3 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar1 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + lVar4;
      *pdVar1 = pdVar3[lVar4];
      pdVar2 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + lVar4;
      *pdVar2 = pdVar3[lVar4];
      clearDualBounds(this,(this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar4],pdVar1,
                      pdVar2);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
  }
  if (0 < (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    lVar4 = 0;
    do {
      pdVar3 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar1 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + lVar4;
      *pdVar1 = -pdVar3[lVar4];
      pdVar2 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + lVar4;
      *pdVar2 = -pdVar3[lVar4];
      clearDualBounds(this,(this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar4],pdVar2,
                      pdVar1);
      pdVar3 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3[lVar4] = -pdVar3[lVar4];
      pdVar3 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3[lVar4] = -pdVar3[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::setDualColBounds()
{

   assert(rep() == COLUMN);

   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   int i;

   for(i = 0; i < this->nRows(); ++i)
   {
      theURbound[i] = this->maxRowObj(i);
      theLRbound[i] = this->maxRowObj(i);

      clearDualBounds(ds.rowStatus(i), theURbound[i], theLRbound[i]);
   }

   for(i = 0; i < this->nCols(); ++i)
   {
      theUCbound[i] = -this->maxObj(i);
      theLCbound[i] = -this->maxObj(i);

      // exchanged ...                 due to definition of slacks!
      clearDualBounds(ds.colStatus(i), theLCbound[i], theUCbound[i]);

      theUCbound[i] *= -1.0;
      theLCbound[i] *= -1.0;
   }
}